

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

alik_object alik_init(int p,int d,int q,int N)

{
  alik_object paVar1;
  uint uVar2;
  double dVar3;
  
  if ((p < 0x65) && (q < 0x65)) {
    paVar1 = (alik_object)malloc((long)N * 0x18 + 0x688);
    paVar1->p = p;
    paVar1->d = d;
    paVar1->q = q;
    paVar1->N = N;
    paVar1->length = N;
    paVar1->pq = q + p;
    paVar1->M = 0;
    if (d == 0) {
      paVar1->pq = q + p + 1;
      paVar1->M = 1;
    }
    uVar2 = q + 1;
    if (q < p) {
      uVar2 = p;
    }
    paVar1->r = uVar2;
    if (0 < (int)uVar2) {
      memset(paVar1->phi,0,(ulong)uVar2 * 8);
      memset(paVar1->theta,0,(ulong)uVar2 << 3);
    }
    dVar3 = macheps();
    paVar1->eps = dVar3;
    paVar1->mean = 0.0;
    return paVar1;
  }
  puts("\n p and q should be less than 100. ");
  puts("Use sarima_init if either p > 100 or q > 100 ");
  exit(1);
}

Assistant:

alik_object alik_init(int p, int d, int q, int N) {
	alik_object obj = NULL;
	int i,t;
	if (p > 100 || q > 100) {
		printf("\n p and q should be less than 100. \n");
		printf("Use sarima_init if either p > 100 or q > 100 \n");
		exit(1);
	}

	obj = (alik_object)malloc(sizeof(struct alik_set) + sizeof(double) * 3 * N);

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->N = N;
	obj->length = N;
	obj->pq = p + q;
	obj->M = 0;

	if (d == 0) {
		obj->pq = obj->pq + 1;
		obj->M = 1;
	}

	obj->r = p;

	t = 1 + q;
	if (obj->r < t) {
		obj->r = t;
	}
	t = obj->r;
	for (i = 0; i < t; ++i) {
		obj->phi[i] = 0.0;
	}

	for (i = 0; i < t; ++i) {
		obj->theta[i] = 0.0;
	}
	obj->eps = macheps();
	obj->mean = 0.0;


	return obj;
}